

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_fprint_leaf(FILE *out,MTBDD leaf)

{
  char *__s;
  char buf [64];
  
  __s = mtbdd_leaf_to_str(leaf,buf,0x40);
  if (__s != (char *)0x0) {
    fputs(__s,(FILE *)out);
    if (__s != buf) {
      free(__s);
    }
  }
  return;
}

Assistant:

void
mtbdd_fprint_leaf(FILE *out, MTBDD leaf)
{
    char buf[64];
    char *ptr = mtbdd_leaf_to_str(leaf, buf, 64);
    if (ptr != NULL) {
        fputs(ptr, out);
        if (ptr != buf) free(ptr);
    }
}